

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGjkEpa2.cpp
# Opt level: O0

bool __thiscall gjkepa2_impl::EPA::expand(EPA *this,U pass,sSV *w,sFace *f,U e,sHorizon *horizon)

{
  bool bVar1;
  EPA *this_00;
  sFace *in_RCX;
  undefined8 in_RDX;
  uint in_ESI;
  sSV *in_RDI;
  uint in_R8D;
  long *in_R9;
  btScalar bVar2;
  sSV *unaff_retaddr;
  EPA *in_stack_00000008;
  U e2;
  sFace *nf;
  U e1;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffc0;
  U UVar3;
  undefined4 in_stack_ffffffffffffffd0;
  U pass_00;
  undefined4 in_stack_ffffffffffffffe8;
  sSV *c;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  pass_00 = (U)((ulong)in_RDX >> 0x20);
  if (in_RCX->pass != in_ESI) {
    UVar3 = expand::i1m3[in_R8D];
    c = in_RDI;
    bVar2 = btDot((btVector3 *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                  &in_RDI->d);
    if (-1e-05 <= bVar2 - ((btVector3 *)&in_RCX->d)->m_floats[0]) {
      in_RCX->pass = (U1)in_ESI;
      bVar1 = expand((EPA *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),pass_00,(sSV *)in_RCX,
                     (sFace *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0),(U)((ulong)in_R9 >> 0x20),
                     (sHorizon *)CONCAT44(UVar3,in_stack_ffffffffffffffc0));
      if ((bVar1) &&
         (bVar1 = expand((EPA *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),pass_00,(sSV *)in_RCX,
                         (sFace *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0),
                         (U)((ulong)in_R9 >> 0x20),
                         (sHorizon *)CONCAT44(UVar3,in_stack_ffffffffffffffc0)), bVar1)) {
        remove((EPA *)(in_RDI + 0x1c3),(char *)in_RCX);
        append((sList *)&in_RDI[0x1c3].w,in_RCX);
        return true;
      }
    }
    else {
      this_00 = (EPA *)newface(in_stack_00000008,unaff_retaddr,
                               (sSV *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                               c,SUB41(in_ESI >> 0x18,0));
      if (this_00 != (EPA *)0x0) {
        bind(this_00,0,(sockaddr *)in_RCX,in_R8D);
        if (*in_R9 == 0) {
          in_R9[1] = (long)this_00;
        }
        else {
          bind((EPA *)*in_R9,1,(sockaddr *)this_00,2);
        }
        *in_R9 = (long)this_00;
        *(int *)(in_R9 + 2) = (int)in_R9[2] + 1;
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool				expand(U pass,sSV* w,sFace* f,U e,sHorizon& horizon)
			{
				static const U	i1m3[]={1,2,0};
				static const U	i2m3[]={2,0,1};
				if(f->pass!=pass)
				{
					const U	e1=i1m3[e];
					if((btDot(f->n,w->w)-f->d)<-EPA_PLANE_EPS)
					{
						sFace*	nf=newface(f->c[e1],f->c[e],w,false);
						if(nf)
						{
							bind(nf,0,f,e);
							if(horizon.cf) bind(horizon.cf,1,nf,2); else horizon.ff=nf;
							horizon.cf=nf;
							++horizon.nf;
							return(true);
						}
					}
					else
					{
						const U	e2=i2m3[e];
						f->pass		=	(U1)pass;
						if(	expand(pass,w,f->f[e1],f->e[e1],horizon)&&
							expand(pass,w,f->f[e2],f->e[e2],horizon))
						{
							remove(m_hull,f);
							append(m_stock,f);
							return(true);
						}
					}
				}
				return(false);
			}